

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeMemoryHashLogging(TranslateToFuzzReader *this)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Name target_00;
  Call *pCVar1;
  mapped_type *pmVar2;
  Type local_c0;
  allocator<wasm::Expression_*> local_b1;
  Call *local_b0;
  Call **local_a8;
  size_type local_a0;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_98;
  Type local_80;
  size_t local_78;
  char *pcStack_70;
  Type local_50;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  size_t local_28;
  char *pcStack_20;
  Call *local_18;
  Call *hash;
  TranslateToFuzzReader *this_local;
  
  local_28 = (this->hashMemoryName).super_IString.str._M_len;
  pcStack_20 = (this->hashMemoryName).super_IString.str._M_str;
  local_48.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hash = (Call *)this;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_48);
  Type::Type(&local_50,i32);
  target_00.super_IString.str._M_str = pcStack_20;
  target_00.super_IString.str._M_len = local_28;
  pCVar1 = Builder::makeCall(&this->builder,target_00,&local_48,local_50,false);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_48);
  local_18 = pCVar1;
  Type::Type(&local_80,i32);
  pmVar2 = std::
           unordered_map<wasm::Type,_wasm::Name,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>_>
           ::operator[](&this->logImportNames,&local_80);
  local_78 = (pmVar2->super_IString).str._M_len;
  pcStack_70 = (pmVar2->super_IString).str._M_str;
  local_b0 = local_18;
  local_a8 = &local_b0;
  local_a0 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_b1);
  __l._M_len = local_a0;
  __l._M_array = (iterator)local_a8;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_98,__l,&local_b1);
  Type::Type(&local_c0,none);
  target.super_IString.str._M_str = pcStack_70;
  target.super_IString.str._M_len = local_78;
  pCVar1 = Builder::makeCall(&this->builder,target,&local_98,local_c0,false);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_98);
  std::allocator<wasm::Expression_*>::~allocator(&local_b1);
  return (Expression *)pCVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryHashLogging() {
  auto* hash = builder.makeCall(hashMemoryName, {}, Type::i32);
  return builder.makeCall(logImportNames[Type::i32], {hash}, Type::none);
}